

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genAggLoopStringCompressed
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t numOfOutViewLoops,string *resetString)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  AggRegTuple *pAVar8;
  string *psVar9;
  TDNode *node_00;
  ulong uVar10;
  bool bVar11;
  size_type sVar12;
  iterator iVar13;
  undefined8 *puVar14;
  long *plVar15;
  long *plVar16;
  size_type sVar17;
  size_t sVar18;
  undefined7 uVar21;
  pointer pvVar19;
  ulong uVar20;
  ulong *puVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  long *plVar25;
  undefined8 *puVar26;
  size_type *psVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  dyn_bitset *pdVar29;
  AggRegTuple *pAVar30;
  AggRegTuple *pAVar31;
  _WordT *p_Var32;
  AggregateIndexes *pAVar33;
  undefined8 uVar34;
  _Alloc_hider _Var35;
  size_t f;
  pointer pbVar36;
  ulong uVar37;
  pointer pAVar38;
  pointer pvVar39;
  long lVar40;
  ulong uVar41;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar42;
  byte bVar43;
  long lVar44;
  long lVar45;
  char cVar46;
  ushort uVar47;
  ulong uVar50;
  byte bVar65;
  byte bVar71;
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  char cVar66;
  byte bVar67;
  char cVar68;
  byte bVar69;
  char cVar70;
  char cVar72;
  byte bVar73;
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  string resetAggregates;
  string productString;
  string __str_2;
  string __str_1;
  string local;
  bitset<7UL> increasingIndexes;
  string depthString;
  prod_bitset removedFunctions;
  prod_bitset subProduct;
  size_t thisLoopID;
  size_t nextLoop;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  ulong *local_680;
  long local_678;
  ulong local_670;
  long lStack_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  string *local_640;
  _Base_bitset<1UL> local_638;
  long local_630;
  ulong local_628;
  long lStack_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  dyn_bitset *local_600;
  long local_5f8;
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0;
  long lStack_5d8;
  ulong *local_5d0;
  long local_5c8;
  ulong local_5c0;
  long lStack_5b8;
  char *local_5b0;
  uint local_5a8;
  char local_5a0 [16];
  TDNode *local_590;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  _WordT local_548;
  ulong *local_4c8;
  long local_4c0;
  ulong local_4b8;
  long lStack_4b0;
  undefined1 local_4a8 [192];
  undefined8 *local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  long local_3c8;
  size_t local_3c0;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong local_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  size_t local_100;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 uVar48;
  undefined6 uVar49;
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined1 auVar58 [14];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  
  bVar43 = 0;
  pdVar42 = (this->listOfLoops).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + currentLoop;
  local_608 = depth;
  local_600 = contributingViews;
  local_3c0 = currentLoop;
  sVar12 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(pdVar42);
  local_110 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_110;
  local_640 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar46 = '\x01';
  if (9 < depth) {
    sVar18 = depth;
    cVar66 = '\x04';
    do {
      cVar46 = cVar66;
      if (sVar18 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_0024e7a9;
      }
      if (sVar18 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_0024e7a9;
      }
      if (sVar18 < 10000) goto LAB_0024e7a9;
      bVar11 = 99999 < sVar18;
      sVar18 = sVar18 / 10000;
      cVar66 = cVar46 + '\x04';
    } while (bVar11);
    cVar46 = cVar46 + '\x01';
  }
LAB_0024e7a9:
  local_5b0 = local_5a0;
  local_610 = depth;
  local_f8 = pdVar42;
  std::__cxx11::string::_M_construct((ulong)&local_5b0,cVar46);
  lVar40 = sVar12 + numOfOutViewLoops;
  std::__detail::__to_chars_10_impl<unsigned_long>(local_5b0,local_5a8,local_610);
  pvVar1 = (this->localProductList).
           super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar36 = pvVar1[currentLoop].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_590 = node;
  local_3c8 = lVar40;
  if (*(pointer *)
       ((long)&pvVar1[currentLoop].
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data + 8) != pbVar36) {
    local_5f8 = lVar40 + 3;
    local_618 = 0;
    uVar41 = 0;
    do {
      local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"");
      lVar44 = 0;
      lVar45 = 0;
      lVar40 = 0;
      do {
        auVar60 = *(undefined1 (*) [16])
                   ((long)(pbVar36->super__Base_bitset<24UL>)._M_w + lVar40 * 8 + local_618);
        auVar74._0_2_ = auVar60._0_2_ >> 1;
        auVar74._2_2_ = auVar60._2_2_ >> 1;
        auVar74._4_2_ = auVar60._4_2_ >> 1;
        auVar74._6_2_ = auVar60._6_2_ >> 1;
        auVar74._8_2_ = auVar60._8_2_ >> 1;
        auVar74._10_2_ = auVar60._10_2_ >> 1;
        auVar74._12_2_ = auVar60._12_2_ >> 1;
        auVar74._14_2_ = auVar60._14_2_ >> 1;
        auVar74 = auVar74 & _DAT_002af680;
        uVar47 = CONCAT11(auVar60[1] - auVar74[1],auVar60[0] - auVar74[0]);
        uVar48 = CONCAT13(auVar60[3] - auVar74[3],CONCAT12(auVar60[2] - auVar74[2],uVar47));
        uVar49 = CONCAT15(auVar60[5] - auVar74[5],CONCAT14(auVar60[4] - auVar74[4],uVar48));
        uVar34 = CONCAT17(auVar60[7] - auVar74[7],CONCAT16(auVar60[6] - auVar74[6],uVar49));
        auVar51._0_10_ = CONCAT19(auVar60[9] - auVar74[9],CONCAT18(auVar60[8] - auVar74[8],uVar34));
        auVar51[10] = auVar60[10] - auVar74[10];
        auVar51[0xb] = auVar60[0xb] - auVar74[0xb];
        auVar55[0xc] = auVar60[0xc] - auVar74[0xc];
        auVar55._0_12_ = auVar51;
        auVar55[0xd] = auVar60[0xd] - auVar74[0xd];
        auVar59[0xe] = auVar60[0xe] - auVar74[0xe];
        auVar59._0_14_ = auVar55;
        auVar59[0xf] = auVar60[0xf] - auVar74[0xf];
        auVar74 = auVar59 & _DAT_002af690;
        auVar60._0_2_ = uVar47 >> 2;
        auVar60._2_2_ = (ushort)((uint)uVar48 >> 0x12);
        auVar60._4_2_ = (ushort)((uint6)uVar49 >> 0x22);
        auVar60._6_2_ = (ushort)((ulong)uVar34 >> 0x32);
        auVar60._8_2_ = (ushort)((unkuint10)auVar51._0_10_ >> 0x42);
        auVar60._10_2_ = auVar51._10_2_ >> 2;
        auVar60._12_2_ = auVar55._12_2_ >> 2;
        auVar60._14_2_ = auVar59._14_2_ >> 2;
        auVar60 = auVar60 & _DAT_002af690;
        cVar46 = auVar60[0] + auVar74[0];
        bVar65 = auVar60[1] + auVar74[1];
        uVar47 = CONCAT11(bVar65,cVar46);
        cVar66 = auVar60[2] + auVar74[2];
        bVar67 = auVar60[3] + auVar74[3];
        uVar48 = CONCAT13(bVar67,CONCAT12(cVar66,uVar47));
        cVar68 = auVar60[4] + auVar74[4];
        bVar69 = auVar60[5] + auVar74[5];
        uVar49 = CONCAT15(bVar69,CONCAT14(cVar68,uVar48));
        cVar70 = auVar60[6] + auVar74[6];
        bVar71 = auVar60[7] + auVar74[7];
        uVar34 = CONCAT17(bVar71,CONCAT16(cVar70,uVar49));
        cVar72 = auVar60[8] + auVar74[8];
        bVar73 = auVar60[9] + auVar74[9];
        auVar52._0_10_ = CONCAT19(bVar73,CONCAT18(cVar72,uVar34));
        auVar52[10] = auVar60[10] + auVar74[10];
        auVar52[0xb] = auVar60[0xb] + auVar74[0xb];
        auVar56[0xc] = auVar60[0xc] + auVar74[0xc];
        auVar56._0_12_ = auVar52;
        auVar56[0xd] = auVar60[0xd] + auVar74[0xd];
        auVar61[0xe] = auVar60[0xe] + auVar74[0xe];
        auVar61._0_14_ = auVar56;
        auVar61[0xf] = auVar60[0xf] + auVar74[0xf];
        auVar75[0] = (char)(uVar47 >> 4) + cVar46;
        auVar75[1] = (bVar65 >> 4) + bVar65;
        auVar75[2] = (char)(ushort)((uint)uVar48 >> 0x14) + cVar66;
        auVar75[3] = (bVar67 >> 4) + bVar67;
        auVar75[4] = (char)(ushort)((uint6)uVar49 >> 0x24) + cVar68;
        auVar75[5] = (bVar69 >> 4) + bVar69;
        auVar75[6] = (char)(ushort)((ulong)uVar34 >> 0x34) + cVar70;
        auVar75[7] = (bVar71 >> 4) + bVar71;
        auVar75[8] = (char)(ushort)((unkuint10)auVar52._0_10_ >> 0x44) + cVar72;
        auVar75[9] = (bVar73 >> 4) + bVar73;
        auVar75[10] = (char)(auVar52._10_2_ >> 4) + auVar52[10];
        auVar75[0xb] = (auVar52[0xb] >> 4) + auVar52[0xb];
        auVar75[0xc] = (char)(auVar56._12_2_ >> 4) + auVar56[0xc];
        auVar75[0xd] = (auVar56[0xd] >> 4) + auVar56[0xd];
        auVar75[0xe] = (char)(auVar61._14_2_ >> 4) + auVar61[0xe];
        auVar75[0xf] = (auVar61[0xf] >> 4) + auVar61[0xf];
        auVar60 = psadbw(auVar75 & _DAT_002af6a0,(undefined1  [16])0x0);
        lVar44 = lVar44 + auVar60._0_8_;
        lVar45 = lVar45 + auVar60._8_8_;
        lVar40 = lVar40 + 2;
      } while (lVar40 != 0x18);
      if ((ulong)(lVar45 + lVar44) < 2) {
LAB_0024ecdf:
        genProductString_abi_cxx11_((string *)local_4a8,this,node,local_600,pbVar36 + uVar41);
        std::__cxx11::string::_M_append((char *)&local_6c0,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        local_610 = local_608;
      }
      else {
        memcpy(local_4a8,pbVar36 + uVar41,0xc0);
        memset(local_588,0,0xc0);
        lVar44 = 0;
        lVar45 = 0;
        lVar40 = 0;
        do {
          do {
            do {
              auVar60 = *(undefined1 (*) [16])(local_4a8 + lVar40 * 8);
              auVar76._0_2_ = auVar60._0_2_ >> 1;
              auVar76._2_2_ = auVar60._2_2_ >> 1;
              auVar76._4_2_ = auVar60._4_2_ >> 1;
              auVar76._6_2_ = auVar60._6_2_ >> 1;
              auVar76._8_2_ = auVar60._8_2_ >> 1;
              auVar76._10_2_ = auVar60._10_2_ >> 1;
              auVar76._12_2_ = auVar60._12_2_ >> 1;
              auVar76._14_2_ = auVar60._14_2_ >> 1;
              auVar76 = auVar76 & _DAT_002af680;
              uVar47 = CONCAT11(auVar60[1] - auVar76[1],auVar60[0] - auVar76[0]);
              uVar48 = CONCAT13(auVar60[3] - auVar76[3],CONCAT12(auVar60[2] - auVar76[2],uVar47));
              uVar49 = CONCAT15(auVar60[5] - auVar76[5],CONCAT14(auVar60[4] - auVar76[4],uVar48));
              uVar34 = CONCAT17(auVar60[7] - auVar76[7],CONCAT16(auVar60[6] - auVar76[6],uVar49));
              auVar53._0_10_ =
                   CONCAT19(auVar60[9] - auVar76[9],CONCAT18(auVar60[8] - auVar76[8],uVar34));
              auVar53[10] = auVar60[10] - auVar76[10];
              auVar53[0xb] = auVar60[0xb] - auVar76[0xb];
              auVar57[0xc] = auVar60[0xc] - auVar76[0xc];
              auVar57._0_12_ = auVar53;
              auVar57[0xd] = auVar60[0xd] - auVar76[0xd];
              auVar62[0xe] = auVar60[0xe] - auVar76[0xe];
              auVar62._0_14_ = auVar57;
              auVar62[0xf] = auVar60[0xf] - auVar76[0xf];
              auVar60 = auVar62 & _DAT_002af690;
              auVar63._0_2_ = uVar47 >> 2;
              auVar63._2_2_ = (ushort)((uint)uVar48 >> 0x12);
              auVar63._4_2_ = (ushort)((uint6)uVar49 >> 0x22);
              auVar63._6_2_ = (ushort)((ulong)uVar34 >> 0x32);
              auVar63._8_2_ = (ushort)((unkuint10)auVar53._0_10_ >> 0x42);
              auVar63._10_2_ = auVar53._10_2_ >> 2;
              auVar63._12_2_ = auVar57._12_2_ >> 2;
              auVar63._14_2_ = auVar62._14_2_ >> 2;
              auVar63 = auVar63 & _DAT_002af690;
              cVar46 = auVar63[0] + auVar60[0];
              bVar65 = auVar63[1] + auVar60[1];
              uVar47 = CONCAT11(bVar65,cVar46);
              cVar66 = auVar63[2] + auVar60[2];
              bVar67 = auVar63[3] + auVar60[3];
              uVar48 = CONCAT13(bVar67,CONCAT12(cVar66,uVar47));
              cVar68 = auVar63[4] + auVar60[4];
              bVar69 = auVar63[5] + auVar60[5];
              uVar49 = CONCAT15(bVar69,CONCAT14(cVar68,uVar48));
              cVar70 = auVar63[6] + auVar60[6];
              bVar71 = auVar63[7] + auVar60[7];
              uVar34 = CONCAT17(bVar71,CONCAT16(cVar70,uVar49));
              cVar72 = auVar63[8] + auVar60[8];
              bVar73 = auVar63[9] + auVar60[9];
              auVar54._0_10_ = CONCAT19(bVar73,CONCAT18(cVar72,uVar34));
              auVar54[10] = auVar63[10] + auVar60[10];
              auVar54[0xb] = auVar63[0xb] + auVar60[0xb];
              auVar58[0xc] = auVar63[0xc] + auVar60[0xc];
              auVar58._0_12_ = auVar54;
              auVar58[0xd] = auVar63[0xd] + auVar60[0xd];
              auVar64[0xe] = auVar63[0xe] + auVar60[0xe];
              auVar64._0_14_ = auVar58;
              auVar64[0xf] = auVar63[0xf] + auVar60[0xf];
              auVar77[0] = (char)(uVar47 >> 4) + cVar46;
              auVar77[1] = (bVar65 >> 4) + bVar65;
              auVar77[2] = (char)(ushort)((uint)uVar48 >> 0x14) + cVar66;
              auVar77[3] = (bVar67 >> 4) + bVar67;
              auVar77[4] = (char)(ushort)((uint6)uVar49 >> 0x24) + cVar68;
              auVar77[5] = (bVar69 >> 4) + bVar69;
              auVar77[6] = (char)(ushort)((ulong)uVar34 >> 0x34) + cVar70;
              auVar77[7] = (bVar71 >> 4) + bVar71;
              auVar77[8] = (char)(ushort)((unkuint10)auVar54._0_10_ >> 0x44) + cVar72;
              auVar77[9] = (bVar73 >> 4) + bVar73;
              auVar77[10] = (char)(auVar54._10_2_ >> 4) + auVar54[10];
              auVar77[0xb] = (auVar54[0xb] >> 4) + auVar54[0xb];
              auVar77[0xc] = (char)(auVar58._12_2_ >> 4) + auVar58[0xc];
              auVar77[0xd] = (auVar58[0xd] >> 4) + auVar58[0xd];
              auVar77[0xe] = (char)(auVar64._14_2_ >> 4) + auVar64[0xe];
              auVar77[0xf] = (auVar64[0xf] >> 4) + auVar64[0xf];
              auVar60 = psadbw(auVar77 & _DAT_002af6a0,_DAT_002a1010);
              lVar44 = lVar44 + auVar60._0_8_;
              lVar45 = lVar45 + auVar60._8_8_;
              lVar40 = lVar40 + 2;
            } while (lVar40 != 0x18);
            uVar50 = lVar45 + lVar44;
            node = local_590;
            if (uVar50 < 2) goto LAB_0024ecdf;
            uVar37 = 0x5dc;
            do {
              if ((*(ulong *)(local_4a8 + (uVar37 >> 6) * 8) >> (uVar37 & 0x3f) & 1) != 0)
              goto LAB_0024e9cb;
              uVar37 = uVar37 - 1;
            } while (uVar37 != 0);
            uVar37 = 0;
LAB_0024e9cb:
            std::bitset<1500UL>::reset((bitset<1500UL> *)local_4a8,uVar37);
            if (0x5db < uVar37) {
              std::__throw_out_of_range_fmt
                        ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar37,
                         0x5dc);
            }
            *(ulong *)(local_588 + (uVar37 >> 6) * 8) =
                 *(ulong *)(local_588 + (uVar37 >> 6) * 8) | 1L << ((byte)uVar37 & 0x3f);
            iVar13 = std::
                     _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->localProductMap).
                             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[currentLoop]._M_h,
                            (key_type *)local_4a8);
            lVar40 = 0;
            lVar44 = 0;
            lVar45 = 0;
          } while (iVar13.
                   super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                   ._M_cur == (__node_type *)0x0);
          lVar40 = 0;
        } while (uVar41 <= *(ulong *)((long)iVar13.
                                            super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                            ._M_cur + 200));
        local_338 = currentLoop * 3;
        uVar37 = *(ulong *)(*(long *)&(this->localProductRemapping).
                                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data +
                           *(ulong *)((long)iVar13.
                                            super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                            ._M_cur + 200) * 8);
        cVar46 = '\x01';
        if (9 < uVar37) {
          uVar20 = uVar37;
          cVar66 = '\x04';
          do {
            cVar46 = cVar66;
            if (uVar20 < 100) {
              cVar46 = cVar46 + -2;
              goto LAB_0024ead2;
            }
            if (uVar20 < 1000) {
              cVar46 = cVar46 + -1;
              goto LAB_0024ead2;
            }
            if (uVar20 < 10000) goto LAB_0024ead2;
            bVar11 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            cVar66 = cVar46 + '\x04';
          } while (bVar11);
          cVar46 = cVar46 + '\x01';
        }
LAB_0024ead2:
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_660,cVar46);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_660._M_dataplus._M_p,(uint)local_660._M_string_length,uVar37);
        std::operator+(&local_6a0,"localRegister[",&local_660);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6a0);
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0.field_2._8_8_ = puVar14[3];
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6e0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_6e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p);
        }
        iVar13 = std::
                 _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->localProductMap).
                         super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[currentLoop]._M_h,
                        (key_type *)local_588);
        if ((iVar13.
             super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>.
             _M_cur == (__node_type *)0x0) ||
           (uVar41 <= *(ulong *)((long)iVar13.
                                       super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                       ._M_cur + 200))) {
          genProductString_abi_cxx11_(&local_6e0,this,local_590,local_600,(prod_bitset *)local_588);
          std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_6e0._M_dataplus._M_p);
          _Var35._M_p = local_6e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) goto LAB_0024ecb2;
        }
        else {
          local_338 = *(ulong *)(*(long *)((long)&(((this->localProductRemapping).
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data + local_338 * 8)
                                + *(ulong *)((long)iVar13.
                                                  super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
                                                  ._M_cur + 200) * 8);
          cVar46 = '\x01';
          if (9 < local_338) {
            uVar37 = local_338;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar37 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_0024f1a3;
              }
              if (uVar37 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_0024f1a3;
              }
              if (uVar37 < 10000) goto LAB_0024f1a3;
              bVar11 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_0024f1a3:
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_6e0._M_dataplus._M_p,(uint)local_6e0._M_string_length,local_338);
          std::__cxx11::string::operator=((string *)&local_660,(string *)&local_6e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p);
          }
          std::operator+(&local_6a0,"localRegister[",&local_660);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6a0);
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
          puVar22 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_6e0.field_2._M_allocated_capacity = *puVar22;
            local_6e0.field_2._8_8_ = puVar14[3];
          }
          else {
            local_6e0.field_2._M_allocated_capacity = *puVar22;
            local_6e0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_6e0._M_string_length = puVar14[1];
          *puVar14 = puVar22;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_6e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p);
          }
          _Var35._M_p = local_6a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
LAB_0024ecb2:
            operator_delete(_Var35._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p);
        }
        node = local_590;
        if (uVar50 < 2) goto LAB_0024ecdf;
      }
      paVar28 = &local_6a0.field_2;
      local_638._M_w = (_WordT)&local_628;
      std::__cxx11::string::_M_construct
                ((ulong)&local_638,((char)local_610 + (char)local_5f8) * '\x03');
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_638);
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_6a0.field_2._M_allocated_capacity = *puVar22;
        local_6a0.field_2._8_8_ = puVar14[3];
        local_6a0._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_6a0.field_2._M_allocated_capacity = *puVar22;
        local_6a0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_6a0._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      uVar50 = this->productCounter;
      cVar46 = '\x01';
      if (9 < uVar50) {
        uVar37 = uVar50;
        cVar66 = '\x04';
        do {
          cVar46 = cVar66;
          if (uVar37 < 100) {
            cVar46 = cVar46 + -2;
            goto LAB_0024ee39;
          }
          if (uVar37 < 1000) {
            cVar46 = cVar46 + -1;
            goto LAB_0024ee39;
          }
          if (uVar37 < 10000) goto LAB_0024ee39;
          bVar11 = 99999 < uVar37;
          uVar37 = uVar37 / 10000;
          cVar66 = cVar46 + '\x04';
        } while (bVar11);
        cVar46 = cVar46 + '\x01';
      }
LAB_0024ee39:
      local_680 = &local_670;
      std::__cxx11::string::_M_construct((ulong)&local_680,cVar46);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar50);
      uVar34 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != paVar28) {
        uVar34 = local_6a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar34 < local_678 + local_6a0._M_string_length) {
        uVar50 = 0xf;
        if (local_680 != &local_670) {
          uVar50 = local_670;
        }
        if (uVar50 < local_678 + local_6a0._M_string_length) goto LAB_0024eebe;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_680,0,(char *)0x0,(ulong)local_6a0._M_dataplus._M_p);
      }
      else {
LAB_0024eebe:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_680)
        ;
      }
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_6e0.field_2._M_allocated_capacity = *puVar22;
        local_6e0.field_2._8_8_ = puVar14[3];
      }
      else {
        local_6e0.field_2._M_allocated_capacity = *puVar22;
        local_6e0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_6e0._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)puVar22 = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6e0);
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_660.field_2._M_allocated_capacity = *puVar22;
        local_660.field_2._8_8_ = puVar14[3];
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      }
      else {
        local_660.field_2._M_allocated_capacity = *puVar22;
        local_660._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_660._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_660,(ulong)local_6c0._M_dataplus._M_p);
      local_588._0_8_ = &local_578;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar23) {
        local_578 = *paVar23;
      }
      else {
        local_578._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar15;
      }
      local_588._8_8_ = plVar15[1];
      *plVar15 = (long)paVar23;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append(local_588);
      local_4a8._0_8_ = local_4a8 + 0x10;
      p_Var32 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p_Var32) {
        local_4a8._16_8_ = *p_Var32;
        local_4a8._24_8_ = puVar14[3];
      }
      else {
        local_4a8._16_8_ = *p_Var32;
        local_4a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar14;
      }
      local_4a8._8_8_ = puVar14[1];
      *puVar14 = p_Var32;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_640,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ != &local_578) {
        operator_delete((void *)local_588._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p);
      }
      if (local_680 != &local_670) {
        operator_delete(local_680);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != paVar28) {
        operator_delete(local_6a0._M_dataplus._M_p);
      }
      if ((ulong *)local_638._M_w != &local_628) {
        operator_delete((void *)local_638._M_w);
      }
      currentLoop = local_3c0;
      sVar18 = this->productCounter;
      *(size_t *)
       (*(long *)&(this->localProductRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_3c0].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + uVar41 * 8) = sVar18;
      this->productCounter = sVar18 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p);
      }
      uVar41 = uVar41 + 1;
      pvVar1 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar36 = pvVar1[currentLoop].
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_618 = local_618 + 0xc0;
    } while (uVar41 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar1[currentLoop].
                                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pbVar36
                              >> 6) * -0x5555555555555555));
  }
  pvVar2 = (this->viewProductList).
           super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar40 = currentLoop * 3;
  if (*(pointer *)
       ((long)&pvVar2[currentLoop].
               super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) !=
      pvVar2[currentLoop].
      super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar23 = &local_660.field_2;
    paVar28 = &local_6c0.field_2;
    local_610 = local_3c8 + 3;
    local_618 = 0;
    local_5f8 = lVar40;
    do {
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"");
      lVar40 = *(long *)((long)&(((this->viewProductList).
                                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                )._M_impl.super__Vector_impl_data + lVar40 * 8);
      plVar25 = *(long **)(lVar40 + 8 + local_618 * 0x18);
      for (plVar15 = *(long **)(lVar40 + local_618 * 0x18); plVar15 != plVar25;
          plVar15 = plVar15 + 2) {
        std::operator+(&local_6e0,"aggregates_",this->viewName + *plVar15);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6e0);
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_660.field_2._M_allocated_capacity = *puVar22;
          local_660.field_2._8_8_ = puVar14[3];
          local_660._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_660.field_2._M_allocated_capacity = *puVar22;
          local_660._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_660._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar41 = plVar15[1];
        cVar46 = '\x01';
        if (9 < uVar41) {
          uVar50 = uVar41;
          cVar66 = '\x04';
          do {
            cVar46 = cVar66;
            if (uVar50 < 100) {
              cVar46 = cVar46 + -2;
              goto LAB_0024f43d;
            }
            if (uVar50 < 1000) {
              cVar46 = cVar46 + -1;
              goto LAB_0024f43d;
            }
            if (uVar50 < 10000) goto LAB_0024f43d;
            bVar11 = 99999 < uVar50;
            uVar50 = uVar50 / 10000;
            cVar66 = cVar46 + '\x04';
          } while (bVar11);
          cVar46 = cVar46 + '\x01';
        }
LAB_0024f43d:
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar46);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_6a0._M_dataplus._M_p,(uint)local_6a0._M_string_length,uVar41);
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != paVar23) {
          uVar34 = local_660.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_6a0._M_string_length + local_660._M_string_length) {
          uVar34 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
            uVar34 = local_6a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < local_6a0._M_string_length + local_660._M_string_length)
          goto LAB_0024f4b9;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_6a0,0,(char *)0x0,(ulong)local_660._M_dataplus._M_p);
        }
        else {
LAB_0024f4b9:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_660,(ulong)local_6a0._M_dataplus._M_p);
        }
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6c0.field_2._M_allocated_capacity = *puVar22;
          local_6c0.field_2._8_8_ = puVar14[3];
          local_6c0._M_dataplus._M_p = (pointer)paVar28;
        }
        else {
          local_6c0.field_2._M_allocated_capacity = *puVar22;
          local_6c0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6c0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_6c0);
        paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 == paVar24) {
          local_578 = *paVar24;
          local_588._0_8_ = &local_578;
        }
        else {
          local_578._M_allocated_capacity = paVar24->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar16;
        }
        local_588._8_8_ = plVar16[1];
        *plVar16 = (long)paVar24;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::__cxx11::string::_M_append(local_4a8,local_588._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) {
          operator_delete((void *)local_588._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != paVar28) {
          operator_delete(local_6c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != paVar23) {
          operator_delete(local_660._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::pop_back();
      local_638._M_w = (_WordT)&local_628;
      std::__cxx11::string::_M_construct
                ((ulong)&local_638,((char)local_608 + (char)local_610) * '\x03');
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_638);
      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_6a0.field_2._M_allocated_capacity = *puVar22;
        local_6a0.field_2._8_8_ = puVar14[3];
      }
      else {
        local_6a0.field_2._M_allocated_capacity = *puVar22;
        local_6a0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_6a0._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      uVar41 = this->viewCounter;
      cVar46 = '\x01';
      if (9 < uVar41) {
        uVar50 = uVar41;
        cVar66 = '\x04';
        do {
          cVar46 = cVar66;
          if (uVar50 < 100) {
            cVar46 = cVar46 + -2;
            goto LAB_0024f702;
          }
          if (uVar50 < 1000) {
            cVar46 = cVar46 + -1;
            goto LAB_0024f702;
          }
          if (uVar50 < 10000) goto LAB_0024f702;
          bVar11 = 99999 < uVar50;
          uVar50 = uVar50 / 10000;
          cVar66 = cVar46 + '\x04';
        } while (bVar11);
        cVar46 = cVar46 + '\x01';
      }
LAB_0024f702:
      local_680 = &local_670;
      std::__cxx11::string::_M_construct((ulong)&local_680,cVar46);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar41);
      uVar34 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        uVar34 = local_6a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar34 < local_678 + local_6a0._M_string_length) {
        uVar41 = 0xf;
        if (local_680 != &local_670) {
          uVar41 = local_670;
        }
        if (uVar41 < local_678 + local_6a0._M_string_length) goto LAB_0024f789;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_680,0,(char *)0x0,(ulong)local_6a0._M_dataplus._M_p);
      }
      else {
LAB_0024f789:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_680)
        ;
      }
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_6e0.field_2._M_allocated_capacity = *puVar22;
        local_6e0.field_2._8_8_ = puVar14[3];
      }
      else {
        local_6e0.field_2._M_allocated_capacity = *puVar22;
        local_6e0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_6e0._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)puVar22 = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6e0);
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_660.field_2._M_allocated_capacity = *puVar22;
        local_660.field_2._8_8_ = puVar14[3];
        local_660._M_dataplus._M_p = (pointer)paVar23;
      }
      else {
        local_660.field_2._M_allocated_capacity = *puVar22;
        local_660._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_660._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,local_4a8._0_8_);
      puVar22 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_6c0.field_2._M_allocated_capacity = *puVar22;
        local_6c0.field_2._8_8_ = puVar14[3];
        local_6c0._M_dataplus._M_p = (pointer)paVar28;
      }
      else {
        local_6c0.field_2._M_allocated_capacity = *puVar22;
        local_6c0._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_6c0._M_string_length = puVar14[1];
      *puVar14 = puVar22;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_6c0);
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar24) {
        local_578 = *paVar24;
        local_588._0_8_ = &local_578;
      }
      else {
        local_578._M_allocated_capacity = paVar24->_M_allocated_capacity;
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar15;
      }
      local_588._8_8_ = plVar15[1];
      *plVar15 = (long)paVar24;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ != &local_578) {
        operator_delete((void *)local_588._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != paVar28) {
        operator_delete(local_6c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != paVar23) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p);
      }
      if (local_680 != &local_670) {
        operator_delete(local_680);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p);
      }
      if ((ulong *)local_638._M_w != &local_628) {
        operator_delete((void *)local_638._M_w);
      }
      lVar40 = local_5f8;
      sVar18 = this->viewCounter;
      *(size_t *)
       (*(long *)((long)&(((this->viewProductRemapping).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + local_5f8 * 8) + local_618 * 8) = sVar18;
      this->viewCounter = sVar18 + 1;
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      pvVar2 = (this->viewProductList).
               super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_618 = local_618 + 1;
    } while (local_618 <
             (ulong)((*(long *)((long)&(pvVar2->
                                       super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar40 * 8 + 8) -
                      *(long *)((long)&(pvVar2->
                                       super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar40 * 8) >> 3) *
                    -0x5555555555555555));
  }
  pvVar3 = (this->nextLoopsPerLoop).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar44 = *(long *)((long)&(pvVar3->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data + lVar40 * 8);
  if (*(long *)((long)&(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data + lVar40 * 8 + 8) != lVar44) {
    local_5f8 = local_3c8 + 3;
    local_108 = local_3c8 + 4;
    uVar41 = 0;
    pdVar42 = local_f8;
    do {
      sVar18 = *(size_t *)(lVar44 + uVar41 * 8);
      local_338 = uVar41;
      local_100 = sVar18;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_4a8,
                       (this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar18,pdVar42);
      bVar11 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_4a8,pdVar42);
      node_00 = local_590;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if (!bVar11) break;
      sVar17 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                         ((this->viewsPerLoop).
                          super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + sVar18,0);
      local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"","");
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"","");
      sVar18 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      cVar46 = (char)local_608;
      if (sVar17 < sVar18) {
        cVar66 = ((char)local_5f8 + cVar46) * '\x03';
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,cVar66);
        plVar15 = (long *)std::__cxx11::string::append((char *)local_50);
        local_210 = &local_200;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_200 = *plVar25;
          lStack_1f8 = plVar15[3];
        }
        else {
          local_200 = *plVar25;
          local_210 = (long *)*plVar15;
        }
        local_208 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_210,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_70 = &local_60;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_60 = *plVar25;
          lStack_58 = plVar15[3];
        }
        else {
          local_60 = *plVar25;
          local_70 = (long *)*plVar15;
        }
        local_68 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_270 = &local_260;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_260 = *puVar22;
          lStack_258 = plVar15[3];
        }
        else {
          local_260 = *puVar22;
          local_270 = (ulong *)*plVar15;
        }
        local_268 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_270,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_250 = &local_240;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_240 = *puVar22;
          lStack_238 = plVar15[3];
        }
        else {
          local_240 = *puVar22;
          local_250 = (ulong *)*plVar15;
        }
        local_248 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_230 = &local_220;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_220 = *puVar22;
          lStack_218 = plVar15[3];
        }
        else {
          local_220 = *puVar22;
          local_230 = (ulong *)*plVar15;
        }
        local_228 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_5b0);
        local_130 = &local_120;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_120 = *plVar25;
          lStack_118 = plVar15[3];
        }
        else {
          local_120 = *plVar25;
          local_130 = (long *)*plVar15;
        }
        local_128 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_4c8 = &local_4b8;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_4b8 = *puVar22;
          lStack_4b0 = puVar14[3];
        }
        else {
          local_4b8 = *puVar22;
          local_4c8 = (ulong *)*puVar14;
        }
        local_4c0 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        local_90 = local_80;
        std::__cxx11::string::_M_construct((ulong)&local_90,cVar66);
        uVar41 = 0xf;
        if (local_4c8 != &local_4b8) {
          uVar41 = local_4b8;
        }
        if (uVar41 < (ulong)(local_88 + local_4c0)) {
          uVar41 = 0xf;
          if (local_90 != local_80) {
            uVar41 = local_80[0];
          }
          if (uVar41 < (ulong)(local_88 + local_4c0)) goto LAB_0025027e;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_4c8);
        }
        else {
LAB_0025027e:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_90);
        }
        local_3e8 = &local_3d8;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_3d8 = *puVar26;
          uStack_3d0 = puVar14[3];
        }
        else {
          local_3d8 = *puVar26;
          local_3e8 = (undefined8 *)*puVar14;
        }
        local_3e0 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
        local_1f0 = &local_1e0;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_1e0 = *plVar15;
          lStack_1d8 = puVar14[3];
        }
        else {
          local_1e0 = *plVar15;
          local_1f0 = (long *)*puVar14;
        }
        local_1e8 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1f0,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_1d0 = &local_1c0;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_1c0 = *plVar15;
          lStack_1b8 = puVar14[3];
        }
        else {
          local_1c0 = *plVar15;
          local_1d0 = (long *)*puVar14;
        }
        local_1c8 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
        local_1b0 = &local_1a0;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_1a0 = *plVar15;
          lStack_198 = puVar14[3];
        }
        else {
          local_1a0 = *plVar15;
          local_1b0 = (long *)*puVar14;
        }
        local_1a8 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b0,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_190 = &local_180;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_180 = *plVar15;
          lStack_178 = puVar14[3];
        }
        else {
          local_180 = *plVar15;
          local_190 = (long *)*puVar14;
        }
        local_188 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
        local_330 = &local_320;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_320 = *puVar22;
          lStack_318 = puVar14[3];
        }
        else {
          local_320 = *puVar22;
          local_330 = (ulong *)*puVar14;
        }
        local_328 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_5b0)
        ;
        local_3b8 = &local_3a8;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_3a8 = *puVar26;
          uStack_3a0 = puVar14[3];
        }
        else {
          local_3a8 = *puVar26;
          local_3b8 = (undefined8 *)*puVar14;
        }
        local_3b0 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3b8);
        local_310 = &local_300;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_300 = *puVar22;
          lStack_2f8 = plVar15[3];
        }
        else {
          local_300 = *puVar22;
          local_310 = (ulong *)*plVar15;
        }
        local_308 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_b0,cVar66);
        uVar41 = 0xf;
        if (local_310 != &local_300) {
          uVar41 = local_300;
        }
        if (uVar41 < (ulong)(local_a8 + local_308)) {
          uVar41 = 0xf;
          if (local_b0 != local_a0) {
            uVar41 = local_a0[0];
          }
          if (uVar41 < (ulong)(local_a8 + local_308)) goto LAB_00250757;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_310);
        }
        else {
LAB_00250757:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_b0);
        }
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_2e0 = *puVar26;
          uStack_2d8 = puVar14[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar26;
          local_2f0 = (undefined8 *)*puVar14;
        }
        local_2e8 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
        local_2d0 = &local_2c0;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_2c0 = *puVar22;
          lStack_2b8 = puVar14[3];
        }
        else {
          local_2c0 = *puVar22;
          local_2d0 = (ulong *)*puVar14;
        }
        local_2c8 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        cVar46 = (cVar46 + (char)local_108) * '\x03';
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct((ulong)&local_d0,cVar46);
        uVar41 = 0xf;
        if (local_2d0 != &local_2c0) {
          uVar41 = local_2c0;
        }
        if (uVar41 < (ulong)(local_c8 + local_2c8)) {
          uVar41 = 0xf;
          if (local_d0 != local_c0) {
            uVar41 = local_c0[0];
          }
          if (uVar41 < (ulong)(local_c8 + local_2c8)) goto LAB_00250ccf;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_2d0);
        }
        else {
LAB_00250ccf:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_d0);
        }
        local_398 = &local_388;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_388 = *puVar26;
          uStack_380 = puVar14[3];
        }
        else {
          local_388 = *puVar26;
          local_398 = (undefined8 *)*puVar14;
        }
        local_390 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_398,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_170 = &local_160;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_160 = *plVar15;
          lStack_158 = puVar14[3];
        }
        else {
          local_160 = *plVar15;
          local_170 = (long *)*puVar14;
        }
        local_168 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
        local_150 = &local_140;
        plVar15 = puVar14 + 2;
        if ((long *)*puVar14 == plVar15) {
          local_140 = *plVar15;
          lStack_138 = puVar14[3];
        }
        else {
          local_140 = *plVar15;
          local_150 = (long *)*puVar14;
        }
        local_148 = puVar14[1];
        *puVar14 = plVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_150,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_2b0 = &local_2a0;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_2a0 = *puVar22;
          lStack_298 = puVar14[3];
        }
        else {
          local_2a0 = *puVar22;
          local_2b0 = (ulong *)*puVar14;
        }
        local_2a8 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
        local_378 = &local_368;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_368 = *puVar26;
          uStack_360 = puVar14[3];
        }
        else {
          local_368 = *puVar26;
          local_378 = (undefined8 *)*puVar14;
        }
        local_370 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_378,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_290 = &local_280;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_280 = *puVar22;
          lStack_278 = puVar14[3];
        }
        else {
          local_280 = *puVar22;
          local_290 = (ulong *)*puVar14;
        }
        local_288 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
        local_358 = &local_348;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_348 = *puVar26;
          uStack_340 = puVar14[3];
        }
        else {
          local_348 = *puVar26;
          local_358 = (undefined8 *)*puVar14;
        }
        local_350 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_358,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_5f0 = &local_5e0;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_5e0 = *puVar22;
          lStack_5d8 = plVar15[3];
        }
        else {
          local_5e0 = *puVar22;
          local_5f0 = (ulong *)*plVar15;
        }
        local_5e8 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_5f0);
        local_5d0 = &local_5c0;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_5c0 = *puVar22;
          lStack_5b8 = plVar15[3];
        }
        else {
          local_5c0 = *puVar22;
          local_5d0 = (ulong *)*plVar15;
        }
        local_5c8 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_f0 = local_e0;
        std::__cxx11::string::_M_construct((ulong)&local_f0,cVar46);
        uVar41 = 0xf;
        if (local_5d0 != &local_5c0) {
          uVar41 = local_5c0;
        }
        if (uVar41 < (ulong)(local_e8 + local_5c8)) {
          uVar41 = 0xf;
          if (local_f0 != local_e0) {
            uVar41 = local_e0[0];
          }
          if (uVar41 < (ulong)(local_e8 + local_5c8)) goto LAB_002512d8;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_5d0);
        }
        else {
LAB_002512d8:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5d0,(ulong)local_f0);
        }
        local_680 = &local_670;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_670 = *puVar22;
          lStack_668 = puVar14[3];
        }
        else {
          local_670 = *puVar22;
          local_680 = (ulong *)*puVar14;
        }
        local_678 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_638._M_w = (_WordT)&local_628;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_628 = *puVar22;
          lStack_620 = plVar15[3];
        }
        else {
          local_628 = *puVar22;
          local_638._M_w = (_WordT)*plVar15;
        }
        local_630 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_638,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        psVar27 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_6a0.field_2._M_allocated_capacity = *psVar27;
          local_6a0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_6a0.field_2._M_allocated_capacity = *psVar27;
          local_6a0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_6a0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar27;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6a0);
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        psVar27 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_6e0.field_2._M_allocated_capacity = *psVar27;
          local_6e0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *psVar27;
          local_6e0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_6e0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar27;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_6e0,
                                     (ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_588._0_8_ = &local_578;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar28) {
          local_578 = *paVar28;
        }
        else {
          local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_588._8_8_ = plVar15[1];
        *plVar15 = (long)paVar28;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append(local_588);
        local_4a8._0_8_ = local_4a8 + 0x10;
        p_Var32 = (_WordT *)(plVar15 + 2);
        if ((_WordT *)*plVar15 == p_Var32) {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._24_8_ = plVar15[3];
        }
        else {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._0_8_ = (_WordT *)*plVar15;
        }
        local_4a8._8_8_ = plVar15[1];
        *plVar15 = (long)p_Var32;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6c0,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) {
          operator_delete((void *)local_588._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p);
        }
        if ((ulong *)local_638._M_w != &local_628) {
          operator_delete((void *)local_638._M_w);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_f0 != local_e0) {
          operator_delete(local_f0);
        }
        if (local_5d0 != &local_5c0) {
          operator_delete(local_5d0);
        }
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        cVar46 = (char)local_608;
        local_5d0 = &local_5c0;
        std::__cxx11::string::_M_construct((ulong)&local_5d0,((char)local_108 + cVar46) * '\x03');
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_5d0);
        local_680 = &local_670;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_670 = *puVar22;
          lStack_668 = puVar14[3];
        }
        else {
          local_670 = *puVar22;
          local_680 = (ulong *)*puVar14;
        }
        local_678 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_680,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_638._M_w = (_WordT)&local_628;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_628 = *puVar22;
          lStack_620 = puVar14[3];
        }
        else {
          local_628 = *puVar22;
          local_638._M_w = (_WordT)*puVar14;
        }
        local_630 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_638);
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        puVar22 = puVar14 + 2;
        local_5f0 = &local_5e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6a0.field_2._M_allocated_capacity = *puVar22;
          local_6a0.field_2._8_8_ = puVar14[3];
        }
        else {
          local_6a0.field_2._M_allocated_capacity = *puVar22;
          local_6a0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6a0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_5f0,(cVar46 + (char)local_5f8) * '\x03');
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          uVar34 = local_6a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_5e8 + local_6a0._M_string_length) {
          uVar41 = 0xf;
          if (local_5f0 != &local_5e0) {
            uVar41 = local_5e0;
          }
          if (uVar41 < local_5e8 + local_6a0._M_string_length) goto LAB_00252399;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_5f0,0,(char *)0x0,(ulong)local_6a0._M_dataplus._M_p);
        }
        else {
LAB_00252399:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_5f0);
        }
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0.field_2._8_8_ = puVar14[3];
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6e0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6e0);
        local_588._0_8_ = &local_578;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar28) {
          local_578 = *paVar28;
        }
        else {
          local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_588._8_8_ = plVar15[1];
        *plVar15 = (long)paVar28;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_588,(ulong)local_660._M_dataplus._M_p);
        local_4a8._0_8_ = local_4a8 + 0x10;
        p_Var32 = puVar14 + 2;
        if ((_WordT *)*puVar14 == p_Var32) {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._24_8_ = puVar14[3];
        }
        else {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._0_8_ = (_WordT *)*puVar14;
        }
        local_4a8._8_8_ = puVar14[1];
        *puVar14 = p_Var32;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_660,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) {
LAB_0025251f:
          operator_delete((void *)local_588._0_8_);
        }
      }
      else {
        cVar66 = ((char)local_5f8 + cVar46) * '\x03';
        local_130 = &local_120;
        std::__cxx11::string::_M_construct((ulong)&local_130,cVar66);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_4c8 = &local_4b8;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_4b8 = *puVar22;
          lStack_4b0 = plVar15[3];
        }
        else {
          local_4b8 = *puVar22;
          local_4c8 = (ulong *)*plVar15;
        }
        local_4c0 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_4c8,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_3e8 = &local_3d8;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_3d8 = *puVar26;
          uStack_3d0 = puVar14[3];
        }
        else {
          local_3d8 = *puVar26;
          local_3e8 = (undefined8 *)*puVar14;
        }
        local_3e0 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3e8);
        local_1f0 = &local_1e0;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_1e0 = *plVar25;
          lStack_1d8 = plVar15[3];
        }
        else {
          local_1e0 = *plVar25;
          local_1f0 = (long *)*plVar15;
        }
        local_1e8 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_1f0,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_1d0 = &local_1c0;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_1c0 = *plVar25;
          lStack_1b8 = plVar15[3];
        }
        else {
          local_1c0 = *plVar25;
          local_1d0 = (long *)*plVar15;
        }
        local_1c8 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
        local_1b0 = &local_1a0;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_1a0 = *plVar25;
          lStack_198 = plVar15[3];
        }
        else {
          local_1a0 = *plVar25;
          local_1b0 = (long *)*plVar15;
        }
        local_1a8 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_5b0);
        local_190 = &local_180;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_180 = *plVar25;
          lStack_178 = plVar15[3];
        }
        else {
          local_180 = *plVar25;
          local_190 = (long *)*plVar15;
        }
        local_188 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_190);
        local_330 = &local_320;
        puVar22 = (ulong *)(plVar15 + 2);
        local_230 = &local_220;
        if ((ulong *)*plVar15 == puVar22) {
          local_320 = *puVar22;
          lStack_318 = plVar15[3];
        }
        else {
          local_320 = *puVar22;
          local_330 = (ulong *)*plVar15;
        }
        local_328 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_230,cVar66);
        uVar41 = 0xf;
        if (local_330 != &local_320) {
          uVar41 = local_320;
        }
        if (uVar41 < (ulong)(local_228 + local_328)) {
          uVar41 = 0xf;
          if (local_230 != &local_220) {
            uVar41 = local_220;
          }
          if (uVar41 < (ulong)(local_228 + local_328)) goto LAB_00250336;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_330);
        }
        else {
LAB_00250336:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_230);
        }
        local_3b8 = &local_3a8;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_3a8 = *puVar26;
          uStack_3a0 = puVar14[3];
        }
        else {
          local_3a8 = *puVar26;
          local_3b8 = (undefined8 *)*puVar14;
        }
        local_3b0 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b8);
        local_310 = &local_300;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_300 = *puVar22;
          lStack_2f8 = puVar14[3];
        }
        else {
          local_300 = *puVar22;
          local_310 = (ulong *)*puVar14;
        }
        local_308 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_310,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_2f0 = &local_2e0;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_2e0 = *puVar26;
          uStack_2d8 = puVar14[3];
        }
        else {
          local_2e0 = *puVar26;
          local_2f0 = (undefined8 *)*puVar14;
        }
        local_2e8 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_2d0 = &local_2c0;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_2c0 = *puVar22;
          lStack_2b8 = plVar15[3];
        }
        else {
          local_2c0 = *puVar22;
          local_2d0 = (ulong *)*plVar15;
        }
        local_2c8 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2d0,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_398 = &local_388;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_388 = *puVar26;
          uStack_380 = puVar14[3];
        }
        else {
          local_388 = *puVar26;
          local_398 = (undefined8 *)*puVar14;
        }
        local_390 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_398);
        local_170 = &local_160;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_160 = *plVar25;
          lStack_158 = plVar15[3];
        }
        else {
          local_160 = *plVar25;
          local_170 = (long *)*plVar15;
        }
        local_168 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_5b0);
        local_150 = &local_140;
        plVar25 = plVar15 + 2;
        if ((long *)*plVar15 == plVar25) {
          local_140 = *plVar25;
          lStack_138 = plVar15[3];
        }
        else {
          local_140 = *plVar25;
          local_150 = (long *)*plVar15;
        }
        local_148 = plVar15[1];
        *plVar15 = (long)plVar25;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_2b0 = &local_2a0;
        puVar22 = (ulong *)(plVar15 + 2);
        local_250 = &local_240;
        if ((ulong *)*plVar15 == puVar22) {
          local_2a0 = *puVar22;
          lStack_298 = plVar15[3];
        }
        else {
          local_2a0 = *puVar22;
          local_2b0 = (ulong *)*plVar15;
        }
        local_2a8 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_250,cVar66);
        uVar41 = 0xf;
        if (local_2b0 != &local_2a0) {
          uVar41 = local_2a0;
        }
        if (uVar41 < (ulong)(local_248 + local_2a8)) {
          uVar41 = 0xf;
          if (local_250 != &local_240) {
            uVar41 = local_240;
          }
          if (uVar41 < (ulong)(local_248 + local_2a8)) goto LAB_00250b54;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2b0);
        }
        else {
LAB_00250b54:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_250);
        }
        local_378 = &local_368;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_368 = *puVar26;
          uStack_360 = puVar14[3];
        }
        else {
          local_368 = *puVar26;
          local_378 = (undefined8 *)*puVar14;
        }
        local_370 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_378);
        local_290 = &local_280;
        puVar22 = (ulong *)(plVar15 + 2);
        local_270 = &local_260;
        if ((ulong *)*plVar15 == puVar22) {
          local_280 = *puVar22;
          lStack_278 = plVar15[3];
        }
        else {
          local_280 = *puVar22;
          local_290 = (ulong *)*plVar15;
        }
        local_288 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        cVar46 = (cVar46 + (char)local_108) * '\x03';
        std::__cxx11::string::_M_construct((ulong)&local_270,cVar46);
        uVar41 = 0xf;
        if (local_290 != &local_280) {
          uVar41 = local_280;
        }
        if (uVar41 < (ulong)(local_268 + local_288)) {
          uVar41 = 0xf;
          if (local_270 != &local_260) {
            uVar41 = local_260;
          }
          if (uVar41 < (ulong)(local_268 + local_288)) goto LAB_00250e4d;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_290);
        }
        else {
LAB_00250e4d:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_270);
        }
        local_358 = &local_348;
        puVar26 = puVar14 + 2;
        if ((undefined8 *)*puVar14 == puVar26) {
          local_348 = *puVar26;
          uStack_340 = puVar14[3];
        }
        else {
          local_348 = *puVar26;
          local_358 = (undefined8 *)*puVar14;
        }
        local_350 = puVar14[1];
        *puVar14 = puVar26;
        puVar14[1] = 0;
        *(undefined1 *)puVar26 = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_358,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_5f0 = &local_5e0;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_5e0 = *puVar22;
          lStack_5d8 = puVar14[3];
        }
        else {
          local_5e0 = *puVar22;
          local_5f0 = (ulong *)*puVar14;
        }
        local_5e8 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_5f0);
        local_5d0 = &local_5c0;
        puVar22 = puVar14 + 2;
        if ((ulong *)*puVar14 == puVar22) {
          local_5c0 = *puVar22;
          lStack_5b8 = puVar14[3];
        }
        else {
          local_5c0 = *puVar22;
          local_5d0 = (ulong *)*puVar14;
        }
        local_5c8 = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_5d0,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_680 = &local_670;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_670 = *puVar22;
          lStack_668 = plVar15[3];
        }
        else {
          local_670 = *puVar22;
          local_680 = (ulong *)*plVar15;
        }
        local_678 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_638._M_w = (_WordT)&local_628;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_628 = *puVar22;
          lStack_620 = plVar15[3];
        }
        else {
          local_628 = *puVar22;
          local_638._M_w = (_WordT)*plVar15;
        }
        local_630 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_638,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        psVar27 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_6a0.field_2._M_allocated_capacity = *psVar27;
          local_6a0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_6a0.field_2._M_allocated_capacity = *psVar27;
          local_6a0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_6a0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar27;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6a0);
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        psVar27 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_6e0.field_2._M_allocated_capacity = *psVar27;
          local_6e0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *psVar27;
          local_6e0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_6e0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar27;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_6e0,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_588._0_8_ = &local_578;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar28) {
          local_578 = *paVar28;
        }
        else {
          local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_588._8_8_ = plVar15[1];
        *plVar15 = (long)paVar28;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append(local_588);
        local_4a8._0_8_ = local_4a8 + 0x10;
        p_Var32 = (_WordT *)(plVar15 + 2);
        if ((_WordT *)*plVar15 == p_Var32) {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._24_8_ = plVar15[3];
        }
        else {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._0_8_ = (_WordT *)*plVar15;
        }
        local_4a8._8_8_ = plVar15[1];
        *plVar15 = (long)p_Var32;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_6c0,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) {
          operator_delete((void *)local_588._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          operator_delete(local_6a0._M_dataplus._M_p);
        }
        if ((ulong *)local_638._M_w != &local_628) {
          operator_delete((void *)local_638._M_w);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_5d0 != &local_5c0) {
          operator_delete(local_5d0);
        }
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8);
        }
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130);
        }
        local_5d0 = &local_5c0;
        std::__cxx11::string::_M_construct((ulong)&local_5d0,cVar46);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_5d0);
        local_680 = &local_670;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_670 = *puVar22;
          lStack_668 = plVar15[3];
        }
        else {
          local_670 = *puVar22;
          local_680 = (ulong *)*plVar15;
        }
        local_678 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_680,(ulong)(node_00->_name)._M_dataplus._M_p);
        local_638._M_w = (_WordT)&local_628;
        puVar22 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar22) {
          local_628 = *puVar22;
          lStack_620 = plVar15[3];
        }
        else {
          local_628 = *puVar22;
          local_638._M_w = (_WordT)*plVar15;
        }
        local_630 = plVar15[1];
        *plVar15 = (long)puVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_638);
        local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
        puVar22 = puVar14 + 2;
        local_5f0 = &local_5e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6a0.field_2._M_allocated_capacity = *puVar22;
          local_6a0.field_2._8_8_ = puVar14[3];
        }
        else {
          local_6a0.field_2._M_allocated_capacity = *puVar22;
          local_6a0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6a0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_5f0,cVar66);
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
          uVar34 = local_6a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_5e8 + local_6a0._M_string_length) {
          uVar41 = 0xf;
          if (local_5f0 != &local_5e0) {
            uVar41 = local_5e0;
          }
          if (uVar41 < local_5e8 + local_6a0._M_string_length) goto LAB_00251b66;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_5f0,0,(char *)0x0,(ulong)local_6a0._M_dataplus._M_p);
        }
        else {
LAB_00251b66:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_5f0);
        }
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0.field_2._8_8_ = puVar14[3];
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        }
        else {
          local_6e0.field_2._M_allocated_capacity = *puVar22;
          local_6e0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6e0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)puVar22 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6e0);
        local_588._0_8_ = &local_578;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar28) {
          local_578 = *paVar28;
        }
        else {
          local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_588._8_8_ = plVar15[1];
        *plVar15 = (long)paVar28;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    (local_588,(ulong)local_660._M_dataplus._M_p);
        p_Var32 = (_WordT *)(plVar15 + 2);
        if ((_WordT *)*plVar15 == p_Var32) {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._24_8_ = plVar15[3];
          local_4a8._0_8_ = local_4a8 + 0x10;
        }
        else {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._0_8_ = (_WordT *)*plVar15;
        }
        local_4a8._8_8_ = plVar15[1];
        *plVar15 = (long)p_Var32;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_660,(string *)local_4a8);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) goto LAB_0025251f;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p);
      }
      if (local_5f0 != &local_5e0) {
        operator_delete(local_5f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p);
      }
      if ((ulong *)local_638._M_w != &local_628) {
        operator_delete((void *)local_638._M_w);
      }
      if (local_680 != &local_670) {
        operator_delete(local_680);
      }
      if (local_5d0 != &local_5c0) {
        operator_delete(local_5d0);
      }
      local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"");
      sVar18 = local_100;
      local_618 = local_608;
      genAggLoopStringCompressed
                ((string *)local_4a8,this,node_00,local_100,local_608,local_600,0,&local_6e0);
      std::__cxx11::string::_M_append((char *)&local_6c0,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588,
                     &local_6e0,&local_6c0);
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)local_588,(ulong)local_660._M_dataplus._M_p)
      ;
      local_4a8._0_8_ = local_4a8 + 0x10;
      p_Var32 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p_Var32) {
        local_4a8._16_8_ = *p_Var32;
        local_4a8._24_8_ = puVar14[3];
      }
      else {
        local_4a8._16_8_ = *p_Var32;
        local_4a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar14;
      }
      local_4a8._8_8_ = puVar14[1];
      *puVar14 = p_Var32;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_640,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._0_8_ != &local_578) {
        operator_delete((void *)local_588._0_8_);
      }
      if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
        pvVar19 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar38 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                     _M_impl.super__Vector_impl_data + 8) != pAVar38) {
          local_610 = (local_5f8 + local_618) * 3;
          uVar41 = 0;
          do {
            if (pAVar38[uVar41].postLoopAgg == true) {
              local_638._M_w = (_WordT)&local_628;
              std::__cxx11::string::_M_construct((ulong)&local_638,(char)local_610);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_638);
              local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
              puVar22 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar22) {
                local_6a0.field_2._M_allocated_capacity = *puVar22;
                local_6a0.field_2._8_8_ = puVar14[3];
              }
              else {
                local_6a0.field_2._M_allocated_capacity = *puVar22;
                local_6a0._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_6a0._M_string_length = puVar14[1];
              *puVar14 = puVar22;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              uVar50 = this->aggregateCounter;
              cVar46 = '\x01';
              if (9 < uVar50) {
                uVar37 = uVar50;
                cVar66 = '\x04';
                do {
                  cVar46 = cVar66;
                  if (uVar37 < 100) {
                    cVar46 = cVar46 + -2;
                    goto LAB_002528c9;
                  }
                  if (uVar37 < 1000) {
                    cVar46 = cVar46 + -1;
                    goto LAB_002528c9;
                  }
                  if (uVar37 < 10000) goto LAB_002528c9;
                  bVar11 = 99999 < uVar37;
                  uVar37 = uVar37 / 10000;
                  cVar66 = cVar46 + '\x04';
                } while (bVar11);
                cVar46 = cVar46 + '\x01';
              }
LAB_002528c9:
              local_680 = &local_670;
              std::__cxx11::string::_M_construct((ulong)&local_680,cVar46);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_680,(uint)local_678,uVar50);
              uVar34 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                uVar34 = local_6a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar34 < local_678 + local_6a0._M_string_length) {
                uVar50 = 0xf;
                if (local_680 != &local_670) {
                  uVar50 = local_670;
                }
                if (uVar50 < local_678 + local_6a0._M_string_length) goto LAB_00252950;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_680,0,(char *)0x0,
                                     (ulong)local_6a0._M_dataplus._M_p);
              }
              else {
LAB_00252950:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_680);
              }
              local_588._0_8_ = &local_578;
              paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar28) {
                local_578._M_local_buf = *(char (*) [16])paVar28;
              }
              else {
                local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
                local_588._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar14;
              }
              local_588._8_8_ = puVar14[1];
              *puVar14 = paVar28;
              puVar14[1] = 0;
              paVar28->_M_local_buf[0] = '\0';
              puVar14 = (undefined8 *)std::__cxx11::string::append(local_588);
              local_4a8._0_8_ = local_4a8 + 0x10;
              p_Var32 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_Var32) {
                local_4a8._16_8_ = *p_Var32;
                local_4a8._24_8_ = puVar14[3];
              }
              else {
                local_4a8._16_8_ = *p_Var32;
                local_4a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar14;
              }
              local_4a8._8_8_ = puVar14[1];
              *puVar14 = p_Var32;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_640,local_4a8._0_8_);
              if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
                operator_delete((void *)local_4a8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._0_8_ != &local_578) {
                operator_delete((void *)local_588._0_8_);
              }
              if (local_680 != &local_670) {
                operator_delete(local_680);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                operator_delete(local_6a0._M_dataplus._M_p);
              }
              if ((ulong *)local_638._M_w != &local_628) {
                operator_delete((void *)local_638._M_w);
              }
              uVar37 = local_618;
              pAVar38 = pAVar38 + uVar41;
              uVar50 = (pAVar38->previous).first;
              uVar20 = (long)(this->listOfLoops).
                             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->listOfLoops).
                             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              if (uVar50 < uVar20) {
                uVar50 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_618].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar50 * 0x18)
                                   + (pAVar38->previous).second * 8);
                cVar46 = '\x01';
                local_4a8._0_8_ = local_4a8 + 0x10;
                if (9 < uVar50) {
                  uVar20 = uVar50;
                  cVar66 = '\x04';
                  do {
                    cVar46 = cVar66;
                    if (uVar20 < 100) {
                      cVar46 = cVar46 + -2;
                      goto LAB_00252b6e;
                    }
                    if (uVar20 < 1000) {
                      cVar46 = cVar46 + -1;
                      goto LAB_00252b6e;
                    }
                    if (uVar20 < 10000) goto LAB_00252b6e;
                    bVar11 = 99999 < uVar20;
                    uVar20 = uVar20 / 10000;
                    cVar66 = cVar46 + '\x04';
                  } while (bVar11);
                  cVar46 = cVar46 + '\x01';
                }
LAB_00252b6e:
                std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar50);
                std::operator+(&local_6a0,"aggregateRegister[",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4a8);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_6a0);
                local_588._0_8_ = &local_578;
                paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 == paVar28) {
                  local_578 = *paVar28;
                }
                else {
                  local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
                  local_588._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar15;
                }
                local_588._8_8_ = plVar15[1];
                *plVar15 = (long)paVar28;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._0_8_ != &local_578) {
                  operator_delete((void *)local_588._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                  operator_delete(local_6a0._M_dataplus._M_p);
                }
                if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
                  operator_delete((void *)local_4a8._0_8_);
                }
                uVar20 = (long)(this->listOfLoops).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->listOfLoops).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
              }
              uVar50 = (pAVar38->postLoop).first;
              if (uVar50 < uVar20) {
                uVar50 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                                
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar50 * 0x18)
                                   + (pAVar38->postLoop).second * 8);
                cVar46 = '\x01';
                local_4a8._0_8_ = local_4a8 + 0x10;
                if (9 < uVar50) {
                  uVar20 = uVar50;
                  cVar66 = '\x04';
                  do {
                    cVar46 = cVar66;
                    if (uVar20 < 100) {
                      cVar46 = cVar46 + -2;
                      goto LAB_00252d34;
                    }
                    if (uVar20 < 1000) {
                      cVar46 = cVar46 + -1;
                      goto LAB_00252d34;
                    }
                    if (uVar20 < 10000) goto LAB_00252d34;
                    bVar11 = 99999 < uVar20;
                    uVar20 = uVar20 / 10000;
                    cVar66 = cVar46 + '\x04';
                  } while (bVar11);
                  cVar46 = cVar46 + '\x01';
                }
LAB_00252d34:
                std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar50);
                std::operator+(&local_6a0,"aggregateRegister[",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4a8);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_6a0);
                paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 == paVar28) {
                  local_578 = *paVar28;
                  local_588._0_8_ = &local_578;
                }
                else {
                  local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
                  local_588._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar15;
                }
                local_588._8_8_ = plVar15[1];
                *plVar15 = (long)paVar28;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._0_8_ != &local_578) {
                  operator_delete((void *)local_588._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                  operator_delete(local_6a0._M_dataplus._M_p);
                }
                if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
                  operator_delete((void *)local_4a8._0_8_);
                }
              }
              psVar9 = local_640;
              std::__cxx11::string::pop_back();
              std::__cxx11::string::append((char *)psVar9);
              sVar4 = this->aggregateCounter;
              *(size_t *)
               (*(long *)(*(long *)&(this->newAggregateRemapping).
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar37].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data + sVar18 * 0x18) + uVar41 * 8)
                   = sVar4;
              this->aggregateCounter = sVar4 + 1;
              pvVar19 = (this->newAggregateRegister).
                        super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar41 = uVar41 + 1;
            pAVar38 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar41 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar19[sVar18].
                                                                                                        
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)pAVar38 >> 4) * 0x6db6db6db6db6db7));
        }
      }
      else {
        uVar50 = 0;
        local_4a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_588._8_8_;
        local_588 = auVar6 << 0x40;
        local_638._M_w = 0;
        local_680 = (ulong *)0x0;
        pvVar19 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar31 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pAVar30 = *(pointer *)
                   ((long)&pvVar19[sVar18].
                           super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                           super__Vector_impl_data + 8);
        uVar41 = ((long)pAVar30 - (long)pAVar31 >> 4) * 0x6db6db6db6db6db7;
        if (pAVar30 == pAVar31) {
          local_610 = 0;
        }
        else {
          uVar21 = (undefined7)(uVar41 >> 8);
          if (pAVar31->postLoopAgg == false) {
            pAVar30 = pAVar31;
            uVar37 = 1;
            do {
              uVar50 = uVar37;
              if (uVar41 + (uVar41 == 0) == uVar50) {
                if (uVar50 < uVar41) goto LAB_00253122;
                goto LAB_0025331f;
              }
              pAVar31 = pAVar30 + 1;
              pAVar8 = pAVar30 + 1;
              pAVar30 = pAVar31;
              uVar37 = uVar50 + 1;
            } while (pAVar8->postLoopAgg != true);
            local_610 = CONCAT71(uVar21,uVar50 < uVar41);
          }
          else {
            local_610 = CONCAT71(uVar21,1);
            uVar50 = 0;
          }
          mapAggregateToIndexes(this,(AggregateIndexes *)local_588,pAVar31,&local_608,&local_100);
          sVar4 = this->aggregateCounter;
          *(size_t *)
           (*(long *)(*(long *)&(this->newAggregateRemapping).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_618].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data + sVar18 * 0x18) + uVar50 * 8) =
               sVar4;
          this->aggregateCounter = sVar4 + 1;
          uVar50 = uVar50 + 1;
          pAVar31 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar41 = ((long)*(pointer *)
                           ((long)&pvVar19[sVar18].
                                   super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                                   _M_impl.super__Vector_impl_data + 8) - (long)pAVar31 >> 4) *
                   0x6db6db6db6db6db7;
        }
        if (uVar50 < uVar41) {
          sVar4 = local_5f8 + local_618;
          lVar40 = uVar50 * 0x70;
          do {
            if ((&pAVar31->postLoopAgg)[lVar40] == true) {
              local_558 = (undefined1  [16])0x0;
              local_568 = (undefined1  [16])0x0;
              local_578 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           )0x0;
              local_588 = (undefined1  [16])0x0;
              local_548 = 0;
              mapAggregateToIndexes
                        (this,(AggregateIndexes *)local_588,
                         (AggRegTuple *)((long)&(pAVar31->previous).first + lVar40),&local_608,
                         &local_100);
              bVar11 = AggregateIndexes::isIncrement
                                 ((AggregateIndexes *)local_588,(AggregateIndexes *)local_4a8,
                                  (size_t *)&local_680,(bitset<7UL> *)&local_638);
              if (bVar11) {
                local_680 = (ulong *)((long)local_680 + 1);
              }
              else {
                outputAggRegTupleString_abi_cxx11_
                          (&local_6a0,this,(AggregateIndexes *)local_4a8,(size_t)local_680,
                           (bitset<7UL> *)&local_638,sVar4,true);
                std::__cxx11::string::_M_append((char *)local_640,(ulong)local_6a0._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                  operator_delete(local_6a0._M_dataplus._M_p);
                }
                p_Var32 = (_WordT *)local_588;
                pAVar33 = (AggregateIndexes *)local_4a8;
                for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
                  (pAVar33->present).super__Base_bitset<1UL>._M_w = *p_Var32;
                  p_Var32 = p_Var32 + (ulong)bVar43 * -2 + 1;
                  pAVar33 = (AggregateIndexes *)((long)pAVar33 + (ulong)bVar43 * -0x10 + 8);
                }
                local_680 = (ulong *)0x0;
              }
              sVar5 = this->aggregateCounter;
              *(size_t *)
               (*(long *)(*(long *)&(this->newAggregateRemapping).
                                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_618].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data + sVar18 * 0x18) + uVar50 * 8)
                   = sVar5;
              this->aggregateCounter = sVar5 + 1;
              pvVar19 = (this->newAggregateRegister).
                        super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar50 = uVar50 + 1;
            pAVar31 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar40 = lVar40 + 0x70;
          } while (uVar50 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar19[sVar18].
                                                                                                        
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                     (long)pAVar31 >> 4) * 0x6db6db6db6db6db7));
        }
        if ((char)local_610 != '\0') {
LAB_00253122:
          outputAggRegTupleString_abi_cxx11_
                    (&local_6a0,this,(AggregateIndexes *)local_4a8,(size_t)local_680,
                     (bitset<7UL> *)&local_638,local_618 + local_5f8,true);
          std::__cxx11::string::_M_append((char *)local_640,(ulong)local_6a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
            operator_delete(local_6a0._M_dataplus._M_p);
          }
        }
      }
LAB_0025331f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
        operator_delete(local_6e0._M_dataplus._M_p);
      }
      pdVar42 = local_f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p);
      }
      uVar41 = local_338 + 1;
      pvVar3 = (this->nextLoopsPerLoop).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar44 = *(long *)&pvVar3[local_3c0].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data;
    } while (uVar41 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar3[local_3c0].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) - lVar44 >> 3));
  }
  sVar18 = local_3c0;
  uVar41 = this->aggregateCounter;
  local_600 = (dyn_bitset *)uVar41;
  if (multifaq::cppgen::COMPRESS_AGGREGATES == '\0') {
    pvVar19 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar38 = pvVar19[local_3c0].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar19[local_3c0].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                 _M_impl.super__Vector_impl_data + 8) == pAVar38) goto LAB_00254945;
    local_610 = local_3c8 + 3;
    uVar50 = 0;
    do {
      if (pAVar38[uVar50].postLoopAgg == false) {
        local_618 = local_608;
        local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_660,((char)local_610 + (char)local_608) * '\x03');
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
        puVar22 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_6c0.field_2._M_allocated_capacity = *puVar22;
          local_6c0.field_2._8_8_ = puVar14[3];
          local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
        }
        else {
          local_6c0.field_2._M_allocated_capacity = *puVar22;
          local_6c0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_6c0._M_string_length = puVar14[1];
        *puVar14 = puVar22;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar41 = this->aggregateCounter;
        cVar46 = '\x01';
        if (9 < uVar41) {
          uVar37 = uVar41;
          cVar66 = '\x04';
          do {
            cVar46 = cVar66;
            if (uVar37 < 100) {
              cVar46 = cVar46 + -2;
              goto LAB_002535c0;
            }
            if (uVar37 < 1000) {
              cVar46 = cVar46 + -1;
              goto LAB_002535c0;
            }
            if (uVar37 < 10000) goto LAB_002535c0;
            bVar11 = 99999 < uVar37;
            uVar37 = uVar37 / 10000;
            cVar66 = cVar46 + '\x04';
          } while (bVar11);
          cVar46 = cVar46 + '\x01';
        }
LAB_002535c0:
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar46);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_6e0._M_dataplus._M_p,(uint)local_6e0._M_string_length,uVar41);
        uVar34 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          uVar34 = local_6c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar34 < local_6e0._M_string_length + local_6c0._M_string_length) {
          uVar34 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            uVar34 = local_6e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < local_6e0._M_string_length + local_6c0._M_string_length)
          goto LAB_00253633;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_6e0,0,(char *)0x0,(ulong)local_6c0._M_dataplus._M_p);
        }
        else {
LAB_00253633:
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_6c0,(ulong)local_6e0._M_dataplus._M_p);
        }
        local_588._0_8_ = &local_578;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 == paVar28) {
          local_578._M_local_buf = *(char (*) [16])paVar28;
        }
        else {
          local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
          local_588._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar14;
        }
        local_588._8_8_ = puVar14[1];
        *puVar14 = paVar28;
        puVar14[1] = 0;
        paVar28->_M_local_buf[0] = '\0';
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_588);
        local_4a8._0_8_ = local_4a8 + 0x10;
        p_Var32 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)p_Var32) {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._24_8_ = puVar14[3];
        }
        else {
          local_4a8._16_8_ = *p_Var32;
          local_4a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar14;
        }
        local_4a8._8_8_ = puVar14[1];
        *puVar14 = p_Var32;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_640,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ != &local_578) {
          operator_delete((void *)local_588._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p);
        }
        pAVar38 = pAVar38 + uVar50;
        uVar41 = (pAVar38->previous).first;
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_4a8 + 0x10);
        if (uVar41 < (ulong)((long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          uVar41 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [pAVar38->prevDepth].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar41 * 0x18)
                             + (pAVar38->previous).second * 8);
          cVar46 = '\x01';
          if (9 < uVar41) {
            uVar37 = uVar41;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar37 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_00253857;
              }
              if (uVar37 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_00253857;
              }
              if (uVar37 < 10000) goto LAB_00253857;
              bVar11 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_00253857:
          local_4a8._0_8_ = paVar28;
          std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar41);
          std::operator+(&local_6c0,"aggregateRegister[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_6c0);
          local_588._0_8_ = &local_578;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 == paVar23) {
            local_578 = *paVar23;
          }
          else {
            local_578._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_588._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar15;
          }
          local_588._8_8_ = plVar15[1];
          *plVar15 = (long)paVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ != &local_578) {
            operator_delete((void *)local_588._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            operator_delete(local_6c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_ != paVar28) {
            operator_delete((void *)local_4a8._0_8_);
          }
        }
        if ((pAVar38->product).first == true) {
          uVar41 = *(ulong *)(*(long *)&(this->localProductRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar18].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar38->product).second * 8);
          cVar46 = '\x01';
          if (9 < uVar41) {
            uVar37 = uVar41;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar37 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_002539d9;
              }
              if (uVar37 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_002539d9;
              }
              if (uVar37 < 10000) goto LAB_002539d9;
              bVar11 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_002539d9:
          local_4a8._0_8_ = paVar28;
          std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar41);
          std::operator+(&local_6c0,"localRegister[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_6c0);
          local_588._0_8_ = &local_578;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 == paVar23) {
            local_578 = *paVar23;
          }
          else {
            local_578._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_588._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar15;
          }
          local_588._8_8_ = plVar15[1];
          *plVar15 = (long)paVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ != &local_578) {
            operator_delete((void *)local_588._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            operator_delete(local_6c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_ != paVar28) {
            operator_delete((void *)local_4a8._0_8_);
          }
        }
        if (pAVar38->newViewProduct == true) {
          uVar41 = *(ulong *)(*(long *)&(this->viewProductRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[sVar18].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar38->viewAgg).second * 8);
          cVar46 = '\x01';
          if (9 < uVar41) {
            uVar37 = uVar41;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar37 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_00253c5c;
              }
              if (uVar37 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_00253c5c;
              }
              if (uVar37 < 10000) goto LAB_00253c5c;
              bVar11 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_00253c5c:
          local_4a8._0_8_ = paVar28;
          std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar41);
          std::operator+(&local_6c0,"viewRegister[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_6c0);
          local_588._0_8_ = &local_578;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 == paVar23) {
            local_578 = *paVar23;
          }
          else {
            local_578._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_588._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar15;
          }
          local_588._8_8_ = plVar15[1];
          *plVar15 = (long)paVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ != &local_578) {
            operator_delete((void *)local_588._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            operator_delete(local_6c0._M_dataplus._M_p);
          }
          _Var35._M_p = (pointer)local_4a8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_ != paVar28) {
LAB_00253d5c:
            operator_delete(_Var35._M_p);
          }
        }
        else {
          if (pAVar38->singleViewAgg != true) goto LAB_00253d61;
          std::operator+(&local_660,"aggregates_",this->viewName + (pAVar38->viewAgg).first);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
          puVar22 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar22) {
            local_6c0.field_2._M_allocated_capacity = *puVar22;
            local_6c0.field_2._8_8_ = puVar14[3];
            local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
          }
          else {
            local_6c0.field_2._M_allocated_capacity = *puVar22;
            local_6c0._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_6c0._M_string_length = puVar14[1];
          *puVar14 = puVar22;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          uVar41 = (pAVar38->viewAgg).second;
          cVar46 = '\x01';
          if (9 < uVar41) {
            uVar37 = uVar41;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar37 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_00253fce;
              }
              if (uVar37 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_00253fce;
              }
              if (uVar37 < 10000) goto LAB_00253fce;
              bVar11 = 99999 < uVar37;
              uVar37 = uVar37 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_00253fce:
          local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_6e0._M_dataplus._M_p,(uint)local_6e0._M_string_length,uVar41);
          uVar34 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            uVar34 = local_6c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar34 < local_6e0._M_string_length + local_6c0._M_string_length) {
            uVar34 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
              uVar34 = local_6e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar34 < local_6e0._M_string_length + local_6c0._M_string_length)
            goto LAB_00254041;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_6e0,0,(char *)0x0,(ulong)local_6c0._M_dataplus._M_p);
          }
          else {
LAB_00254041:
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_6c0,(ulong)local_6e0._M_dataplus._M_p);
          }
          local_588._0_8_ = &local_578;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 == paVar23) {
            local_578._M_local_buf = *(char (*) [16])paVar23;
          }
          else {
            local_578._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_588._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar14;
          }
          local_588._8_8_ = puVar14[1];
          *puVar14 = paVar23;
          puVar14[1] = 0;
          paVar23->_M_local_buf[0] = '\0';
          puVar14 = (undefined8 *)std::__cxx11::string::append(local_588);
          p_Var32 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p_Var32) {
            local_4a8._16_8_ = *p_Var32;
            local_4a8._24_8_ = puVar14[3];
            local_4a8._0_8_ = paVar28;
          }
          else {
            local_4a8._16_8_ = *p_Var32;
            local_4a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar14;
          }
          local_4a8._8_8_ = puVar14[1];
          *puVar14 = p_Var32;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_640,local_4a8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._0_8_ != paVar28) {
            operator_delete((void *)local_4a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ != &local_578) {
            operator_delete((void *)local_588._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
            operator_delete(local_6e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            operator_delete(local_6c0._M_dataplus._M_p);
          }
          _Var35._M_p = local_660._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_660._M_dataplus._M_p != &local_660.field_2) goto LAB_00253d5c;
        }
LAB_00253d61:
        if (pAVar38->multiplyByCount == true) {
          std::__cxx11::string::append((char *)local_640);
        }
        uVar37 = local_618;
        uVar41 = (pAVar38->postLoop).first;
        if (uVar41 < (ulong)((long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->listOfLoops).
                                   super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          uVar41 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_618].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + uVar41 * 0x18)
                             + (pAVar38->postLoop).second * 8);
          cVar46 = '\x01';
          if (9 < uVar41) {
            uVar20 = uVar41;
            cVar66 = '\x04';
            do {
              cVar46 = cVar66;
              if (uVar20 < 100) {
                cVar46 = cVar46 + -2;
                goto LAB_00253e2e;
              }
              if (uVar20 < 1000) {
                cVar46 = cVar46 + -1;
                goto LAB_00253e2e;
              }
              if (uVar20 < 10000) goto LAB_00253e2e;
              bVar11 = 99999 < uVar20;
              uVar20 = uVar20 / 10000;
              cVar66 = cVar46 + '\x04';
            } while (bVar11);
            cVar46 = cVar46 + '\x01';
          }
LAB_00253e2e:
          local_4a8._0_8_ = local_4a8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_4a8,cVar46);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar41);
          std::operator+(&local_6c0,"aggregateRegister[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4a8);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_6c0);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 == paVar28) {
            local_578 = *paVar28;
            local_588._0_8_ = &local_578;
          }
          else {
            local_578._M_allocated_capacity = paVar28->_M_allocated_capacity;
            local_588._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar15;
          }
          local_588._8_8_ = plVar15[1];
          *plVar15 = (long)paVar28;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_640,local_588._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ != &local_578) {
            operator_delete((void *)local_588._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            operator_delete(local_6c0._M_dataplus._M_p);
          }
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_);
          }
        }
        psVar9 = local_640;
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)psVar9);
        sVar4 = this->aggregateCounter;
        *(size_t *)
         (*(long *)(*(long *)&(this->newAggregateRemapping).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar37].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data + sVar18 * 0x18) + uVar50 * 8) =
             sVar4;
        uVar41 = sVar4 + 1;
        this->aggregateCounter = uVar41;
        pvVar19 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar50 = uVar50 + 1;
      pAVar38 = pvVar19[sVar18].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar50 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar19[sVar18].
                                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pAVar38
                              >> 4) * 0x6db6db6db6db6db7));
  }
  else {
    uVar37 = 0;
    local_4a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_588._8_8_;
    local_588 = auVar7 << 0x40;
    local_660._M_dataplus._M_p = (pointer)0x0;
    local_6e0._M_dataplus._M_p = (pointer)0x0;
    pvVar39 = (this->newAggregateRegister).
              super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar19 = pvVar39 + local_3c0;
    pAVar31 = (pvVar19->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pAVar30 = *(pointer *)
               ((long)&(pvVar19->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                       _M_impl.super__Vector_impl_data + 8);
    uVar50 = ((long)pAVar30 - (long)pAVar31 >> 4) * 0x6db6db6db6db6db7;
    if (pAVar30 == pAVar31) {
      local_590 = (TDNode *)0x0;
    }
    else {
      uVar20 = uVar50 + (uVar50 == 0);
      uVar21 = (undefined7)(uVar20 >> 8);
      if (pAVar31->postLoopAgg == true) {
        pAVar30 = pAVar31;
        uVar10 = 1;
        do {
          uVar37 = uVar10;
          if (uVar20 == uVar37) {
            if (uVar50 <= uVar37) goto LAB_00254475;
            goto LAB_002543fe;
          }
          pAVar31 = pAVar30 + 1;
          pAVar8 = pAVar30 + 1;
          pAVar30 = pAVar31;
          uVar10 = uVar37 + 1;
        } while (pAVar8->postLoopAgg != false);
        local_590 = (TDNode *)CONCAT71(uVar21,uVar37 < uVar50);
      }
      else {
        local_590 = (TDNode *)CONCAT71(uVar21,1);
        uVar37 = 0;
      }
      mapAggregateToIndexes(this,(AggregateIndexes *)local_4a8,pAVar31,&local_608,&local_3c0);
      *(dyn_bitset **)
       (*(long *)(*(long *)&(this->newAggregateRemapping).
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_608].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data + sVar18 * 0x18) + uVar37 * 8) =
           local_600;
      uVar41 = this->aggregateCounter + 1;
      this->aggregateCounter = uVar41;
      uVar37 = uVar37 + 1;
      pAVar31 = (pvVar19->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar50 = ((long)*(pointer *)
                       ((long)&(pvVar19->
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                               _M_impl.super__Vector_impl_data + 8) - (long)pAVar31 >> 4) *
               0x6db6db6db6db6db7;
    }
    if (uVar37 < uVar50) {
      local_610 = local_3c8 + local_608 + 3;
      lVar40 = uVar37 * 0x70;
      local_618 = local_608 * 3;
      do {
        if ((&pAVar31->postLoopAgg)[lVar40] == false) {
          local_558 = (undefined1  [16])0x0;
          local_568 = (undefined1  [16])0x0;
          local_578 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       )0x0;
          local_588 = (undefined1  [16])0x0;
          local_548 = 0;
          mapAggregateToIndexes
                    (this,(AggregateIndexes *)local_588,
                     (AggRegTuple *)
                     (*(long *)&(pvVar19->
                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>).
                                _M_impl.super__Vector_impl_data + lVar40),&local_608,&local_3c0);
          bVar11 = AggregateIndexes::isIncrement
                             ((AggregateIndexes *)local_588,(AggregateIndexes *)local_4a8,
                              (size_t *)&local_6e0,(bitset<7UL> *)&local_660);
          if (bVar11) {
            local_6e0._M_dataplus._M_p = local_6e0._M_dataplus._M_p + 1;
          }
          else {
            outputAggRegTupleString_abi_cxx11_
                      (&local_6c0,this,(AggregateIndexes *)local_4a8,
                       (size_t)local_6e0._M_dataplus._M_p,(bitset<7UL> *)&local_660,local_610,false)
            ;
            std::__cxx11::string::_M_append((char *)local_640,(ulong)local_6c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
              operator_delete(local_6c0._M_dataplus._M_p);
            }
            pAVar33 = (AggregateIndexes *)local_588;
            p_Var32 = (_WordT *)local_4a8;
            for (lVar44 = 9; lVar44 != 0; lVar44 = lVar44 + -1) {
              *p_Var32 = (pAVar33->present).super__Base_bitset<1UL>._M_w;
              pAVar33 = (AggregateIndexes *)((long)pAVar33 + (ulong)bVar43 * -0x10 + 8);
              p_Var32 = p_Var32 + (ulong)bVar43 * -2 + 1;
            }
            local_6e0._M_dataplus._M_p = (pointer)0x0;
          }
          sVar4 = this->aggregateCounter;
          *(size_t *)
           (*(long *)(*(long *)((long)&(((this->newAggregateRemapping).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       )._M_impl.super__Vector_impl_data + local_618 * 8) +
                     sVar18 * 0x18) + uVar37 * 8) = sVar4;
          uVar41 = sVar4 + 1;
          this->aggregateCounter = uVar41;
          pvVar39 = (this->newAggregateRegister).
                    super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar37 = uVar37 + 1;
        pvVar19 = pvVar39 + sVar18;
        pAVar31 = (pvVar19->super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar40 = lVar40 + 0x70;
      } while (uVar37 < (ulong)(((long)*(pointer *)
                                        ((long)&(pvVar19->
                                                super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                )._M_impl.super__Vector_impl_data + 8) -
                                 (long)pAVar31 >> 4) * 0x6db6db6db6db6db7));
    }
    if ((char)local_590 != '\0') {
LAB_002543fe:
      outputAggRegTupleString_abi_cxx11_
                (&local_6c0,this,(AggregateIndexes *)local_4a8,(size_t)local_6e0._M_dataplus._M_p,
                 (bitset<7UL> *)&local_660,local_3c8 + local_608 + 3,false);
      std::__cxx11::string::_M_append((char *)local_640,(ulong)local_6c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
        operator_delete(local_6c0._M_dataplus._M_p);
      }
      uVar41 = this->aggregateCounter;
    }
  }
LAB_00254475:
  if (uVar41 <= local_600) goto LAB_00254945;
  cVar46 = '\x03';
  if (local_3c8 != 0) {
    cVar46 = (char)local_3c8 + '\x02';
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_6a0,(cVar46 + (char)local_608) * '\x03');
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_6a0);
  paVar28 = &local_6e0.field_2;
  puVar22 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_6e0.field_2._M_allocated_capacity = *puVar22;
    local_6e0.field_2._8_8_ = puVar14[3];
    local_6e0._M_dataplus._M_p = (pointer)paVar28;
  }
  else {
    local_6e0.field_2._M_allocated_capacity = *puVar22;
    local_6e0._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_6e0._M_string_length = puVar14[1];
  *puVar14 = puVar22;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  cVar46 = '\x01';
  if (9 < local_600) {
    pdVar29 = local_600;
    cVar66 = '\x04';
    do {
      cVar46 = cVar66;
      if (pdVar29 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_00254592;
      }
      if (pdVar29 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_00254592;
      }
      if (pdVar29 < 10000) goto LAB_00254592;
      bVar11 = 99999 < pdVar29;
      pdVar29 = (dyn_bitset *)((ulong)pdVar29 / 10000);
      cVar66 = cVar46 + '\x04';
    } while (bVar11);
    cVar46 = cVar46 + '\x01';
  }
LAB_00254592:
  local_638._M_w = (_WordT)&local_628;
  std::__cxx11::string::_M_construct((ulong)&local_638,cVar46);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_638._M_w,(uint)local_630,(unsigned_long)local_600);
  uVar34 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != paVar28) {
    uVar34 = local_6e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar34 < local_630 + local_6e0._M_string_length) {
    uVar41 = 0xf;
    if ((ulong *)local_638._M_w != &local_628) {
      uVar41 = local_628;
    }
    if (uVar41 < local_630 + local_6e0._M_string_length) goto LAB_00254615;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_638,0,(char *)0x0,(ulong)local_6e0._M_dataplus._M_p);
  }
  else {
LAB_00254615:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6e0,local_638._M_w);
  }
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  puVar22 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_660.field_2._M_allocated_capacity = *puVar22;
    local_660.field_2._8_8_ = puVar14[3];
  }
  else {
    local_660.field_2._M_allocated_capacity = *puVar22;
    local_660._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_660._M_string_length = puVar14[1];
  *puVar14 = puVar22;
  puVar14[1] = 0;
  *(undefined1 *)puVar22 = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_660);
  paVar23 = &local_6c0.field_2;
  puVar22 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_6c0.field_2._M_allocated_capacity = *puVar22;
    local_6c0.field_2._8_8_ = puVar14[3];
    local_6c0._M_dataplus._M_p = (pointer)paVar23;
  }
  else {
    local_6c0.field_2._M_allocated_capacity = *puVar22;
    local_6c0._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_6c0._M_string_length = puVar14[1];
  *puVar14 = puVar22;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  uVar41 = this->aggregateCounter - (long)local_600;
  cVar46 = '\x01';
  if (9 < uVar41) {
    uVar50 = uVar41;
    cVar66 = '\x04';
    do {
      cVar46 = cVar66;
      if (uVar50 < 100) {
        cVar46 = cVar46 + -2;
        goto LAB_00254752;
      }
      if (uVar50 < 1000) {
        cVar46 = cVar46 + -1;
        goto LAB_00254752;
      }
      if (uVar50 < 10000) goto LAB_00254752;
      bVar11 = 99999 < uVar50;
      uVar50 = uVar50 / 10000;
      cVar66 = cVar46 + '\x04';
    } while (bVar11);
    cVar46 = cVar46 + '\x01';
  }
LAB_00254752:
  local_680 = &local_670;
  std::__cxx11::string::_M_construct((ulong)&local_680,cVar46);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar41);
  uVar34 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != paVar23) {
    uVar34 = local_6c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar34 < local_678 + local_6c0._M_string_length) {
    uVar41 = 0xf;
    if (local_680 != &local_670) {
      uVar41 = local_670;
    }
    if (uVar41 < local_678 + local_6c0._M_string_length) goto LAB_002547c6;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_680,0,(char *)0x0,(ulong)local_6c0._M_dataplus._M_p);
  }
  else {
LAB_002547c6:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_680);
  }
  local_588._0_8_ = &local_578;
  paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar24) {
    local_578._M_local_buf = *(char (*) [16])paVar24;
  }
  else {
    local_578._M_allocated_capacity = paVar24->_M_allocated_capacity;
    local_588._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar14;
  }
  local_588._8_8_ = puVar14[1];
  *puVar14 = paVar24;
  puVar14[1] = 0;
  paVar24->_M_local_buf[0] = '\0';
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_588);
  p_Var32 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p_Var32) {
    local_4a8._16_8_ = *p_Var32;
    local_4a8._24_8_ = puVar14[3];
    local_4a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_4a8 + 0x10);
  }
  else {
    local_4a8._16_8_ = *p_Var32;
    local_4a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar14;
  }
  local_4a8._8_8_ = puVar14[1];
  *puVar14 = p_Var32;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  std::__cxx11::string::_M_append((char *)resetString,local_4a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_4a8 + 0x10)) {
    operator_delete((void *)local_4a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != &local_578) {
    operator_delete((void *)local_588._0_8_);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != paVar23) {
    operator_delete(local_6c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p);
  }
  if ((ulong *)local_638._M_w != &local_628) {
    operator_delete((void *)local_638._M_w);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != paVar28) {
    operator_delete(local_6e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p);
  }
LAB_00254945:
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  return local_640;
}

Assistant:

std::string CppGenerator::genAggLoopStringCompressed(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews,const size_t numOfOutViewLoops,
    std::string& resetString)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[thisLoopID];
    size_t numOfLoops = thisLoop.count() + numOfOutViewLoops;
    
    std::string returnString = "";
    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];
        
        // std::cout << product << std::endl;
        
        bool decomposedProduct = false;
        std::string productString = "";

        // We now check if parts of the product have already been computed 
        if (product.count() > 1)
        {
            prod_bitset subProduct = product;
            prod_bitset removedFunctions;

            size_t subProductID;

            bool foundSubProduct = false;
            while (!foundSubProduct && subProduct.count() > 1)
            {
                size_t highestPosition = 0;
                // need to continue with this the next loop
                for (size_t f = NUM_OF_FUNCTIONS; f > 0; f--)
                {
                    if (subProduct[f])
                    {
                        highestPosition = f;
                        break;
                    }
                }
                
                subProduct.reset(highestPosition);
                removedFunctions.set(highestPosition);

                auto local_it = localProductMap[thisLoopID].find(subProduct);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = true;
                    subProductID = local_it->second;
                }
            }
            

            if (foundSubProduct)
            {
                std::string local = std::to_string(
                    localProductRemapping[thisLoopID][subProductID]);

                productString += "localRegister["+local+"]*";
                    
                auto local_it = localProductMap[thisLoopID].find(removedFunctions);
                if (local_it != localProductMap[thisLoopID].end() &&
                    local_it->second < prodID)
                {
                    foundSubProduct = false;
                    subProductID = local_it->second;

                    local = std::to_string(
                        localProductRemapping[thisLoopID][subProductID]);
                    productString += "localRegister["+local+"]";
                }
                else
                {
                    productString += genProductString(
                        node,contributingViews,removedFunctions);
                }

                decomposedProduct = true;
            }
        }
        
        // We turn the product into a string
        if (!decomposedProduct)
            productString += genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString + ";\n";
        
        // increment the counter and update the remapping array
        localProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size(); ++viewProd)
    {   
        std::string viewProduct = "";
        for (const std::pair<size_t, size_t>& viewAgg : viewProductList[thisLoopID][viewProd])
        {
            viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
                std::to_string(viewAgg.second)+"]*";
        }   
        viewProduct.pop_back();

        returnString += offset(3+depth+numOfLoops)+
            "viewRegister["+std::to_string(viewCounter)+"] = "+
            viewProduct +";\n";

        // Increment the counter and update the remapping array
        viewProductRemapping[thisLoopID][viewProd] = viewCounter;
        ++viewCounter;
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) == thisLoop))
        {
            size_t viewID = viewsPerLoop[nextLoop].find_first();

            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            std::string resetAggregates = "";

            loopString += genAggLoopStringCompressed(
                node, nextLoop, depth, contributingViews, 0, resetAggregates);

            returnString += resetAggregates + loopString + closeLoopString;

            if (COMPRESS_AGGREGATES)
            {                    
                // After recurse, add the aggregates that have been added with post FLAG
                AggregateIndexes bench, aggIdx;
                std::bitset<7> increasingIndexes;
                size_t aggID = 0, off = 0;

                bool addedAggregates = false;

                // Loop to identify the first bench
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;

                        ++aggID; // TODO: Make sure that this is necessary!!
                        addedAggregates = true;
                        break;
                    }
                }   
            
                // Loop over all other aggregates 
                for (; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        aggIdx.reset();
                    
                        mapAggregateToIndexes(aggIdx,regTuple,depth,nextLoop);

                        if (aggIdx.isIncrement(bench,off,increasingIndexes))
                        {
                            ++off;
                        }
                        else
                        {
                            // If not, output bench and all offset aggregates
                            returnString += outputAggRegTupleString(
                                bench,off,increasingIndexes, 3+depth+numOfLoops,true);
                        
                            // make aggregate the bench and set offset to 0
                            bench = aggIdx;
                            off = 0;
                        }

                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }

                // Output bench -- and any further aggregates (if there were any)
                if (addedAggregates)
                    returnString += outputAggRegTupleString(
                        bench,off,increasingIndexes,3+depth+numOfLoops,true);
            }
            else
            {
                // here we output the aggregates uncompressed -TODO: we could probably
                // remove this and incorporate it in the previous part
            
                // After recurse, add the aggregates that have been added with post FLAG
                for (size_t aggID = 0; aggID <
                         newAggregateRegister[nextLoop].size(); ++aggID)
                {
                    const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                    if (regTuple.postLoopAgg)
                    {
                        // We use a mapping to the correct index
                        returnString += offset(3+depth+numOfLoops)+
                            "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

                        if (regTuple.previous.first < listOfLoops.size())
                        {
                            std::string local = std::to_string(
                                newAggregateRemapping[depth]
                                [regTuple.previous.first]
                                [regTuple.previous.second]);
                            returnString += "aggregateRegister["+local+"]*";
                        }

                        if (regTuple.postLoop.first < listOfLoops.size())
                        {
                            std::string post = std::to_string(
                                newAggregateRemapping[depth][regTuple.postLoop.first]
                                [regTuple.postLoop.second]); 
                            returnString += "aggregateRegister["+post+"]*";
                        }
                        
                        returnString.pop_back();
                        returnString += ";\n";
            
                        // Increment the counter and update the remapping array
                        newAggregateRemapping[depth][nextLoop][aggID] = aggregateCounter;
                        ++aggregateCounter;
                    }
                }
            }
        }
        else break;
    }
    
    size_t startingOffset = aggregateCounter;
    
    if (COMPRESS_AGGREGATES)
    {        
        // After recurse, add the aggregates that have been added with post FLAG
        AggregateIndexes bench, aggIdx;
        std::bitset<7> increasingIndexes;
        size_t aggID = 0, off = 0;
    
        bool addedAggregates = false;

        // Loop to identify the first bench
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                mapAggregateToIndexes
                    (bench,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);
            
                addedAggregates = true;

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;

                ++aggID;
                break;
            }
        }

        // Loop over all other aggregates 
        for (; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                aggIdx.reset();
            
                mapAggregateToIndexes
                    (aggIdx,newAggregateRegister[thisLoopID][aggID],depth,thisLoopID);

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputAggRegTupleString(bench,off,increasingIndexes,
                                                            3+depth+numOfLoops,false);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                }

                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }

        // Output bench -- and any further aggregates (if there were any)
        if (addedAggregates)
            returnString += outputAggRegTupleString(
                bench,off,increasingIndexes,3+depth+numOfLoops,false);
    }
    else
    {
        
        for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
        {
            const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
            if (!regTuple.postLoopAgg)
            {
                // We use a mapping to the correct index
                returnString += offset(3+depth+numOfLoops)+
                    "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

                if (regTuple.previous.first < listOfLoops.size())
                {
                    std::string prev = std::to_string(
                        newAggregateRemapping[regTuple.prevDepth]
                        [regTuple.previous.first]
                        [regTuple.previous.second]);
                
                    returnString += "aggregateRegister["+prev+"]*";
                }
            
                if (regTuple.product.first)
                {
                    std::string local = std::to_string(
                        localProductRemapping[thisLoopID][regTuple.product.second]
                        );
                    returnString += "localRegister["+local+"]*";
                }
        
                if (regTuple.newViewProduct)
                {
                    std::string view = std::to_string(
                        viewProductRemapping[thisLoopID][regTuple.viewAgg.second]);
                    returnString += "viewRegister["+view+"];";
                }
                else if (regTuple.singleViewAgg)
                {
                    returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                        std::to_string(regTuple.viewAgg.second)+"]*";
                }
            
                if (regTuple.multiplyByCount)
                    returnString +=  "count*";

                if (regTuple.postLoop.first < listOfLoops.size())
                {
                    std::string postLoop = std::to_string(
                        newAggregateRemapping[depth][regTuple.postLoop.first]
                        [regTuple.postLoop.second]);
                    returnString += "aggregateRegister["+postLoop+"]*";
                }
            
                returnString.pop_back();
                returnString += ";\n";
            
                // Increment the counter and update the remapping array
                newAggregateRemapping[depth][thisLoopID][aggID] = aggregateCounter;
                ++aggregateCounter;
            }
        }
    }
    

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    return returnString;
}